

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
FastVector<RegVmCmd,_false,_false>::grow(FastVector<RegVmCmd,_false,_false> *this,uint newSize)

{
  RegVmCmd *pRVar1;
  
  pRVar1 = this->data;
  grow_no_destroy(this,newSize);
  if (pRVar1 != (RegVmCmd *)0x0) {
    (*(code *)NULLC::dealloc)(pRVar1);
    return;
  }
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}